

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void infof_certstack(Curl_easy *data,SSL *ssl)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  OPENSSL_STACK *pOVar6;
  undefined8 uVar7;
  X509_ALGOR **local_190;
  char *local_180;
  undefined1 local_168 [8];
  char group_name [80];
  char *type_name;
  int get_group_name;
  int key_sec_bits;
  int key_bits;
  EVP_PKEY *current_pkey;
  X509 *current_cert;
  ASN1_OBJECT *paobj_cert;
  X509_ALGOR *palg_cert;
  char group_name_final [80];
  char cert_algorithm [80];
  uint local_30;
  int cert_level;
  int num_cert_levels;
  long verify_result;
  stack_st_X509 *certstack;
  SSL *ssl_local;
  Curl_easy *data_local;
  
  lVar5 = SSL_get_verify_result((SSL *)ssl);
  if (lVar5 == 0) {
    verify_result = SSL_get0_verified_chain(ssl);
  }
  else {
    verify_result = (long)SSL_get_peer_cert_chain((SSL *)ssl);
  }
  pOVar6 = ossl_check_const_X509_sk_type((stack_st_X509 *)verify_result);
  iVar1 = OPENSSL_sk_num(pOVar6);
  for (local_30 = 0; (int)local_30 < iVar1; local_30 = local_30 + 1) {
    memset(group_name_final + 0x48,0,0x50);
    memset(&palg_cert,0,0x50);
    paobj_cert = (ASN1_OBJECT *)0x0;
    current_cert = (X509 *)0x0;
    pOVar6 = ossl_check_const_X509_sk_type((stack_st_X509 *)verify_result);
    uVar7 = OPENSSL_sk_value(pOVar6,local_30);
    X509_get0_signature(0,&paobj_cert,uVar7);
    X509_ALGOR_get0((ASN1_OBJECT **)&current_cert,(int *)0x0,(void **)0x0,(X509_ALGOR *)paobj_cert);
    OBJ_obj2txt(group_name_final + 0x48,0x50,(ASN1_OBJECT *)current_cert,0);
    uVar7 = X509_get0_pubkey(uVar7);
    uVar2 = EVP_PKEY_get_bits(uVar7);
    uVar3 = EVP_PKEY_get_security_bits(uVar7);
    memset(local_168,0,0x50);
    iVar4 = EVP_PKEY_get_group_name(uVar7,local_168,0x50,0);
    curl_msnprintf((char *)&palg_cert,0x50,"/%s",local_168);
    local_180 = (char *)EVP_PKEY_get0_type_name(uVar7);
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      if (local_180 == (char *)0x0) {
        local_180 = "?";
      }
      if (iVar4 == 0) {
        local_190 = (X509_ALGOR **)0x1017437;
      }
      else {
        local_190 = &palg_cert;
      }
      Curl_infof(data,
                 "  Certificate level %d: Public key type %s%s (%d/%d Bits/secBits), signed using %s"
                 ,(ulong)local_30,local_180,local_190,(ulong)uVar2,uVar3,group_name_final + 0x48);
    }
  }
  return;
}

Assistant:

static void infof_certstack(struct Curl_easy *data, const SSL *ssl)
{
  STACK_OF(X509) *certstack;
  long verify_result;
  int num_cert_levels;
  int cert_level;

  verify_result = SSL_get_verify_result(ssl);
  if(verify_result != X509_V_OK)
    certstack = SSL_get_peer_cert_chain(ssl);
  else
    certstack = SSL_get0_verified_chain(ssl);
  num_cert_levels = sk_X509_num(certstack);

  for(cert_level = 0; cert_level < num_cert_levels; cert_level++) {
    char cert_algorithm[80] = "";
    char group_name_final[80] = "";
    const X509_ALGOR *palg_cert = NULL;
    const ASN1_OBJECT *paobj_cert = NULL;
    X509 *current_cert;
    EVP_PKEY *current_pkey;
    int key_bits;
    int key_sec_bits;
    int get_group_name;
    const char *type_name;

    current_cert = sk_X509_value(certstack, cert_level);

    X509_get0_signature(NULL, &palg_cert, current_cert);
    X509_ALGOR_get0(&paobj_cert, NULL, NULL, palg_cert);
    OBJ_obj2txt(cert_algorithm, sizeof(cert_algorithm), paobj_cert, 0);

    current_pkey = X509_get0_pubkey(current_cert);
    key_bits = EVP_PKEY_bits(current_pkey);
#if (OPENSSL_VERSION_NUMBER < 0x30000000L)
#define EVP_PKEY_get_security_bits EVP_PKEY_security_bits
#endif
    key_sec_bits = EVP_PKEY_get_security_bits(current_pkey);
#if (OPENSSL_VERSION_NUMBER >= 0x30000000L)
    {
      char group_name[80] = "";
      get_group_name = EVP_PKEY_get_group_name(current_pkey, group_name,
                                               sizeof(group_name), NULL);
      msnprintf(group_name_final, sizeof(group_name_final), "/%s", group_name);
    }
    type_name = EVP_PKEY_get0_type_name(current_pkey);
#else
    get_group_name = 0;
    type_name = NULL;
#endif

    infof(data,
          "  Certificate level %d: "
          "Public key type %s%s (%d/%d Bits/secBits), signed using %s",
          cert_level, type_name ? type_name : "?",
          get_group_name == 0 ? "" : group_name_final,
          key_bits, key_sec_bits, cert_algorithm);
  }
}